

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

SubpixelAntialiasingType __thiscall QKmsOutput::subpixelAntialiasingTypeHint(QKmsOutput *this)

{
  QKmsOutput *this_local;
  SubpixelAntialiasingType local_4;
  
  switch(this->subpixel) {
  default:
    local_4 = Subpixel_None;
    break;
  case 2:
    local_4 = Subpixel_RGB;
    break;
  case 3:
    local_4 = Subpixel_BGR;
    break;
  case 4:
    local_4 = Subpixel_VRGB;
    break;
  case 5:
    local_4 = Subpixel_VBGR;
  }
  return local_4;
}

Assistant:

QPlatformScreen::SubpixelAntialiasingType QKmsOutput::subpixelAntialiasingTypeHint() const
{
    switch (subpixel) {
    default:
    case DRM_MODE_SUBPIXEL_UNKNOWN:
    case DRM_MODE_SUBPIXEL_NONE:
        return QPlatformScreen::Subpixel_None;
    case DRM_MODE_SUBPIXEL_HORIZONTAL_RGB:
        return QPlatformScreen::Subpixel_RGB;
    case DRM_MODE_SUBPIXEL_HORIZONTAL_BGR:
        return QPlatformScreen::Subpixel_BGR;
    case DRM_MODE_SUBPIXEL_VERTICAL_RGB:
        return QPlatformScreen::Subpixel_VRGB;
    case DRM_MODE_SUBPIXEL_VERTICAL_BGR:
        return QPlatformScreen::Subpixel_VBGR;
    }
}